

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8_fp16.h
# Opt level: O3

void ncnn::conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  size_t sVar1;
  long lVar2;
  unsigned_short uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  unsigned_short *puVar8;
  float *pfVar9;
  int iVar10;
  long local_b0;
  long local_a8;
  Mat local_78;
  
  Mat::reshape(&local_78,kernel,1,num_input,num_output,(Allocator *)0x0);
  iVar5 = num_input + 7;
  if (-1 < num_input) {
    iVar5 = num_input;
  }
  iVar10 = num_output + 7;
  if (-1 < num_output) {
    iVar10 = num_output;
  }
  Mat::create(weight_data_pack8,1,iVar5 >> 3,iVar10 >> 3,0x80,0x40,(Allocator *)0x0);
  if (7 < num_output) {
    local_a8 = 0;
    local_b0 = 0;
    do {
      if (7 < num_input) {
        lVar6 = local_78.elemsize * local_78.cstep;
        sVar1 = weight_data_pack8->elemsize;
        iVar5 = weight_data_pack8->w;
        puVar8 = (unsigned_short *)
                 ((long)weight_data_pack8->data + sVar1 * weight_data_pack8->cstep * local_a8 + 0x7e
                 );
        pfVar9 = (float *)(lVar6 * local_b0 + (long)local_78.data);
        lVar7 = (local_78.cstep * -7 + (long)local_78.w) * local_78.elemsize;
        lVar4 = local_78.elemsize * (long)local_78.w;
        iVar10 = 7;
        do {
          uVar3 = float32_to_float16(*pfVar9);
          puVar8[-0x3f] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6));
          puVar8[-0x3e] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 * 2));
          puVar8[-0x3d] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 * 3));
          puVar8[-0x3c] = uVar3;
          uVar3 = float32_to_float16(pfVar9[lVar6]);
          puVar8[-0x3b] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 * 5));
          puVar8[-0x3a] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 * 6));
          puVar8[-0x39] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 * 7));
          puVar8[-0x38] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar6 * 7));
          lVar2 = lVar7 + lVar6 * 7;
          puVar8[-0x37] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x36] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x35] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x34] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x33] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x32] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x31] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x30] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar2));
          lVar2 = lVar7 + lVar2;
          puVar8[-0x2f] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x2e] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x2d] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x2c] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x2b] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x2a] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x29] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x28] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar2));
          lVar2 = lVar7 + lVar2;
          puVar8[-0x27] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x26] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x25] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x24] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x23] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x22] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x21] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x20] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar2));
          lVar2 = lVar7 + lVar2;
          puVar8[-0x1f] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x1e] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x1d] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x1c] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x1b] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x1a] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x19] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x18] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar2));
          lVar2 = lVar7 + lVar2;
          puVar8[-0x17] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x16] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x15] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x14] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x13] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x12] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x11] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0x10] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar2));
          lVar2 = lVar7 + lVar2;
          puVar8[-0xf] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0xe] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0xd] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0xc] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-0xb] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-10] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-9] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-8] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar7 + lVar2));
          lVar2 = lVar7 + lVar2;
          puVar8[-7] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-6] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-5] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-4] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-3] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          lVar2 = lVar6 + lVar2;
          puVar8[-2] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 + lVar2));
          puVar8[-1] = uVar3;
          uVar3 = float32_to_float16(*(float *)((long)pfVar9 + lVar6 * 2 + lVar2));
          *puVar8 = uVar3;
          puVar8 = (unsigned_short *)((long)puVar8 + (long)iVar5 * sVar1);
          pfVar9 = pfVar9 + lVar4 * 2;
          iVar10 = iVar10 + 8;
        } while (iVar10 < num_input);
      }
      local_b0 = local_b0 + 8;
      local_a8 = local_a8 + 1;
    } while ((int)((uint)local_b0 | 7) < num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)2 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            unsigned short* g00 = (unsigned short*)g0.row(p / 8);
            g00[0] = float32_to_float16(k00[0]);
            g00[1] = float32_to_float16(k10[0]);
            g00[2] = float32_to_float16(k20[0]);
            g00[3] = float32_to_float16(k30[0]);
            g00[4] = float32_to_float16(k40[0]);
            g00[5] = float32_to_float16(k50[0]);
            g00[6] = float32_to_float16(k60[0]);
            g00[7] = float32_to_float16(k70[0]);
            g00 += 8;
            g00[0] = float32_to_float16(k01[0]);
            g00[1] = float32_to_float16(k11[0]);
            g00[2] = float32_to_float16(k21[0]);
            g00[3] = float32_to_float16(k31[0]);
            g00[4] = float32_to_float16(k41[0]);
            g00[5] = float32_to_float16(k51[0]);
            g00[6] = float32_to_float16(k61[0]);
            g00[7] = float32_to_float16(k71[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k02[0]);
            g00[1] = float32_to_float16(k12[0]);
            g00[2] = float32_to_float16(k22[0]);
            g00[3] = float32_to_float16(k32[0]);
            g00[4] = float32_to_float16(k42[0]);
            g00[5] = float32_to_float16(k52[0]);
            g00[6] = float32_to_float16(k62[0]);
            g00[7] = float32_to_float16(k72[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k03[0]);
            g00[1] = float32_to_float16(k13[0]);
            g00[2] = float32_to_float16(k23[0]);
            g00[3] = float32_to_float16(k33[0]);
            g00[4] = float32_to_float16(k43[0]);
            g00[5] = float32_to_float16(k53[0]);
            g00[6] = float32_to_float16(k63[0]);
            g00[7] = float32_to_float16(k73[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k04[0]);
            g00[1] = float32_to_float16(k14[0]);
            g00[2] = float32_to_float16(k24[0]);
            g00[3] = float32_to_float16(k34[0]);
            g00[4] = float32_to_float16(k44[0]);
            g00[5] = float32_to_float16(k54[0]);
            g00[6] = float32_to_float16(k64[0]);
            g00[7] = float32_to_float16(k74[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k05[0]);
            g00[1] = float32_to_float16(k15[0]);
            g00[2] = float32_to_float16(k25[0]);
            g00[3] = float32_to_float16(k35[0]);
            g00[4] = float32_to_float16(k45[0]);
            g00[5] = float32_to_float16(k55[0]);
            g00[6] = float32_to_float16(k65[0]);
            g00[7] = float32_to_float16(k75[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k06[0]);
            g00[1] = float32_to_float16(k16[0]);
            g00[2] = float32_to_float16(k26[0]);
            g00[3] = float32_to_float16(k36[0]);
            g00[4] = float32_to_float16(k46[0]);
            g00[5] = float32_to_float16(k56[0]);
            g00[6] = float32_to_float16(k66[0]);
            g00[7] = float32_to_float16(k76[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k07[0]);
            g00[1] = float32_to_float16(k17[0]);
            g00[2] = float32_to_float16(k27[0]);
            g00[3] = float32_to_float16(k37[0]);
            g00[4] = float32_to_float16(k47[0]);
            g00[5] = float32_to_float16(k57[0]);
            g00[6] = float32_to_float16(k67[0]);
            g00[7] = float32_to_float16(k77[0]);

            g00 += 8;
        }
    }
}